

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::add_example_conditioning
               (search_private *priv,example *ec,size_t condition_on_cnt,char *condition_on_names,
               action_repr *condition_on_actions)

{
  ulong uVar1;
  example *peVar2;
  size_t sVar3;
  wclass *pwVar4;
  stringstream *psVar5;
  ostream *poVar6;
  float *pfVar7;
  long lVar8;
  unsigned_long *puVar9;
  long in_RCX;
  ulong in_RDX;
  example *in_RSI;
  search_private *in_RDI;
  long in_R8;
  features *con_fs;
  uint64_t fid_1;
  size_t k;
  char name_1;
  features *fs;
  size_t i_1;
  uint64_t name;
  size_t n;
  uint64_t fid;
  size_t i;
  size_t N;
  size_t I;
  uint64_t extra_offset;
  parameters *in_stack_fffffffffffffec8;
  search_private *in_stack_fffffffffffffed0;
  example *in_stack_fffffffffffffed8;
  string *psVar10;
  vw *in_stack_fffffffffffffee0;
  allocator *paVar11;
  allocator local_e1;
  string local_e0 [32];
  uint64_t local_c0;
  ulong local_b8;
  char local_a9;
  v_array<float> *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  allocator local_71;
  string local_70 [32];
  long local_50;
  ulong local_48;
  size_t local_40;
  ulong local_38;
  ulong local_30;
  long local_28;
  long local_20;
  ulong local_18;
  example *local_10;
  search_private *local_8;
  
  if (in_RDX != 0) {
    local_30 = 0;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (((in_RDI->is_ldf & 1U) != 0) &&
       (sVar3 = v_array<COST_SENSITIVE::wclass>::size
                          ((v_array<COST_SENSITIVE::wclass> *)&(in_RSI->l).simple), sVar3 != 0)) {
      pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&(local_10->l).simple,0);
      local_30 = (ulong)(pwVar4->class_index * 0x3abb39);
    }
    local_38 = local_18;
    local_40 = max((local_8->acset).max_bias_ngram_length,(local_8->acset).max_quad_ngram_length);
    for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
      local_50 = local_30 * 0x81904f + 0x118fd;
      if ((local_8->all->audit & 1U) != 0) {
        psVar5 = &local_8->dat_new_feature_audit_ss;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"",&local_71);
        std::__cxx11::stringstream::str((string *)psVar5);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        std::ios::clear((int)local_8 + 0x358 +
                        (int)*(undefined8 *)(*(long *)&local_8->dat_new_feature_audit_ss + -0x18));
        local_8->dat_new_feature_feature_space = (string *)condition_feature_space_abi_cxx11_;
      }
      for (local_90 = 0; (local_90 < local_40 && (local_48 + local_90 < local_38));
          local_90 = local_90 + 1) {
        local_98 = (ulong)*(char *)(local_20 + local_48 + local_90);
        local_50 = local_50 * 0x504c5 +
                   (ulong)(*(int *)(local_28 + (local_48 + local_90) * 0x10) + 0x553ad) *
                   (local_98 + 0x24b5019) * 0x118fd;
        local_8->dat_new_feature_ec = local_10;
        local_8->dat_new_feature_idx = local_50 * 0x1aa5cfd;
        local_8->dat_new_feature_namespace = 0x86;
        local_8->dat_new_feature_value = (local_8->acset).feature_value;
        if ((local_8->all->audit & 1U) != 0) {
          if (local_90 != 0) {
            std::operator<<((ostream *)&local_8->field_0x368,',');
          }
          if ((local_98 < 0x21) || (0x7e < local_98)) {
            poVar6 = std::operator<<((ostream *)&local_8->field_0x368,'#');
            std::ostream::operator<<(poVar6,(int)local_98);
          }
          else {
            std::ostream::operator<<(&local_8->field_0x368,local_98);
          }
          poVar6 = std::operator<<((ostream *)&local_8->field_0x368,'=');
          std::ostream::operator<<(poVar6,*(uint *)(local_28 + (local_48 + local_90) * 0x10));
        }
        if (local_90 < (local_8->acset).max_bias_ngram_length) {
          parameters::stride_shift(in_stack_fffffffffffffec8);
          add_new_feature((search_private *)condition_on_actions,extra_offset._4_4_,I);
        }
        if (local_90 < (local_8->acset).max_quad_ngram_length) {
          GD::foreach_feature<Search::search_private,_unsigned_long,_&Search::add_new_feature>
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        }
      }
    }
    if (((local_8->acset).use_passthrough_repr & 1U) != 0) {
      for (local_a0 = 0; local_a0 < local_38; local_a0 = local_a0 + 1) {
        if (*(long *)(local_28 + local_a0 * 0x10 + 8) != 0) {
          local_a8 = *(v_array<float> **)(local_28 + local_a0 * 0x10 + 8);
          local_a9 = *(char *)(local_20 + local_a0);
          for (local_b8 = 0; uVar1 = local_b8, sVar3 = features::size((features *)0x39a8cb),
              uVar1 < sVar3; local_b8 = local_b8 + 1) {
            pfVar7 = v_array<float>::operator[](local_a8,local_b8);
            if ((1e-10 < *pfVar7) ||
               (pfVar7 = v_array<float>::operator[](local_a8,local_b8), *pfVar7 < -1e-10)) {
              lVar8 = local_30 + (long)(local_a9 * 0x801071);
              puVar9 = v_array<unsigned_long>::operator[]
                                 ((v_array<unsigned_long> *)(local_a8 + 1),local_b8);
              local_c0 = lVar8 * 0x2e2185b + 0x14bb1 + (*puVar9 + 0x131b) * 0xcd1c9;
              if ((local_8->all->audit & 1U) != 0) {
                psVar10 = (string *)&local_8->dat_new_feature_audit_ss;
                paVar11 = &local_e1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_e0,"",paVar11);
                std::__cxx11::stringstream::str(psVar10);
                std::__cxx11::string::~string(local_e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_e1);
                std::ios::clear((int)local_8 + 0x358 +
                                (int)*(undefined8 *)
                                      (*(long *)&local_8->dat_new_feature_audit_ss + -0x18));
                poVar6 = std::operator<<((ostream *)&local_8->field_0x368,"passthrough_repr_");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_a0);
                poVar6 = std::operator<<(poVar6,'_');
                std::ostream::operator<<(poVar6,local_b8);
              }
              local_8->dat_new_feature_ec = local_10;
              local_8->dat_new_feature_idx = local_c0;
              local_8->dat_new_feature_namespace = 0x86;
              pfVar7 = v_array<float>::operator[](local_a8,local_b8);
              local_8->dat_new_feature_value = *pfVar7;
              in_stack_fffffffffffffed0 = local_8;
              parameters::stride_shift(in_stack_fffffffffffffec8);
              add_new_feature((search_private *)condition_on_actions,extra_offset._4_4_,I);
            }
          }
        }
      }
    }
    peVar2 = local_10;
    sVar3 = features::size((features *)0x39abcc);
    if ((sVar3 == 0) || ((peVar2->super_example_predict).feature_space[0x86].sum_feat_sq <= 0.0)) {
      features::clear((features *)in_stack_fffffffffffffed0);
    }
    else {
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)in_stack_fffffffffffffed0,
                 &in_stack_fffffffffffffec8->sparse);
      local_10->total_sum_feat_sq =
           (peVar2->super_example_predict).feature_space[0x86].sum_feat_sq +
           local_10->total_sum_feat_sq;
      sVar3 = features::size((features *)0x39ac29);
      local_10->num_features = sVar3 + local_10->num_features;
    }
  }
  return;
}

Assistant:

void add_example_conditioning(search_private& priv, example& ec, size_t condition_on_cnt,
    const char* condition_on_names, action_repr* condition_on_actions)
{
  if (condition_on_cnt == 0)
    return;

  uint64_t extra_offset = 0;
  if (priv.is_ldf)
    if (ec.l.cs.costs.size() > 0)
      extra_offset = 3849017 * ec.l.cs.costs[0].class_index;

  size_t I = condition_on_cnt;
  size_t N = max(priv.acset.max_bias_ngram_length, priv.acset.max_quad_ngram_length);
  for (size_t i = 0; i < I; i++)  // position in conditioning
  {
    uint64_t fid = 71933 + 8491087 * extra_offset;
    if (priv.all->audit)
    {
      priv.dat_new_feature_audit_ss.str("");
      priv.dat_new_feature_audit_ss.clear();
      priv.dat_new_feature_feature_space = &condition_feature_space;
    }

    for (size_t n = 0; n < N; n++)  // length of ngram
    {
      if (i + n >= I)
        break;  // no more ngrams
      // we're going to add features for the ngram condition_on_actions[i .. i+N]
      uint64_t name = condition_on_names[i + n];
      fid = fid * 328901 + 71933 * ((condition_on_actions[i + n].a + 349101) * (name + 38490137));

      priv.dat_new_feature_ec = &ec;
      priv.dat_new_feature_idx = fid * quadratic_constant;
      priv.dat_new_feature_namespace = conditioning_namespace;
      priv.dat_new_feature_value = priv.acset.feature_value;

      if (priv.all->audit)
      {
        if (n > 0)
          priv.dat_new_feature_audit_ss << ',';
        if ((33 <= name) && (name <= 126))
          priv.dat_new_feature_audit_ss << name;
        else
          priv.dat_new_feature_audit_ss << '#' << (int)name;
        priv.dat_new_feature_audit_ss << '=' << condition_on_actions[i + n].a;
      }

      // add the single bias feature
      if (n < priv.acset.max_bias_ngram_length)
        add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
      // add the quadratic features
      if (n < priv.acset.max_quad_ngram_length)
        GD::foreach_feature<search_private, uint64_t, add_new_feature>(*priv.all, ec, priv);
    }
  }

  if (priv.acset.use_passthrough_repr)
  {
    cdbg << "BEGIN adding passthrough features" << endl;
    for (size_t i = 0; i < I; i++)
    {
      if (condition_on_actions[i].repr == nullptr)
        continue;
      features& fs = *(condition_on_actions[i].repr);
      char name = condition_on_names[i];
      for (size_t k = 0; k < fs.size(); k++)
        if ((fs.values[k] > 1e-10) || (fs.values[k] < -1e-10))
        {
          uint64_t fid = 84913 + 48371803 * (extra_offset + 8392817 * name) + 840137 * (4891 + fs.indicies[k]);
          if (priv.all->audit)
          {
            priv.dat_new_feature_audit_ss.str("");
            priv.dat_new_feature_audit_ss.clear();
            priv.dat_new_feature_audit_ss << "passthrough_repr_" << i << '_' << k;
          }

          priv.dat_new_feature_ec = &ec;
          priv.dat_new_feature_idx = fid;
          priv.dat_new_feature_namespace = conditioning_namespace;
          priv.dat_new_feature_value = fs.values[k];
          add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
        }
    }
    cdbg << "END adding passthrough features" << endl;
  }

  features& con_fs = ec.feature_space[conditioning_namespace];
  if ((con_fs.size() > 0) && (con_fs.sum_feat_sq > 0.))
  {
    ec.indices.push_back(conditioning_namespace);
    ec.total_sum_feat_sq += con_fs.sum_feat_sq;
    ec.num_features += con_fs.size();
  }
  else
    con_fs.clear();
}